

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int j;
  int iVar2;
  uint uVar3;
  bool bVar4;
  code *local_88 [2];
  code *local_78;
  code *local_70;
  thread_pool pool;
  future<int> add_future;
  promise<int> add_promise;
  
  ycqian::thread_pool::thread_pool(&pool,8);
  iVar2 = 10;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    local_88[0] = (code *)0x0;
    local_88[1] = (code *)0x0;
    local_70 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/QianYC[P]libycqian/examples/thread/thread_pool.cpp:21:22)>
               ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/QianYC[P]libycqian/examples/thread/thread_pool.cpp:21:22)>
               ::_M_manager;
    ycqian::thread_pool::execute(&pool,(function<void_()> *)local_88);
    std::_Function_base::~_Function_base((_Function_base *)local_88);
  }
  local_88[1] = (code *)0x0;
  local_88[0] = foo;
  local_70 = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
  local_78 = std::_Function_handler<void_(),_void_(*)()>::_M_manager;
  ycqian::thread_pool::execute(&pool,(function<void_()> *)local_88);
  std::_Function_base::~_Function_base((_Function_base *)local_88);
  local_88[1] = (code *)0x0;
  local_88[0] = bar;
  local_70 = std::_Function_handler<void_(),_int_(*)()>::_M_invoke;
  local_78 = std::_Function_handler<void_(),_int_(*)()>::_M_manager;
  ycqian::thread_pool::execute(&pool,(function<void_()> *)local_88);
  std::_Function_base::~_Function_base((_Function_base *)local_88);
  local_88[1] = (code *)0x0;
  local_88[0] = var;
  local_70 = std::_Function_handler<void_(),_A_(*)()>::_M_invoke;
  local_78 = std::_Function_handler<void_(),_A_(*)()>::_M_manager;
  ycqian::thread_pool::execute(&pool,(function<void_()> *)local_88);
  std::_Function_base::~_Function_base((_Function_base *)local_88);
  for (uVar3 = 0; uVar3 != 4; uVar3 = uVar3 + 1) {
    local_88[1] = (code *)0x0;
    local_88[0] = (code *)(ulong)uVar3;
    local_70 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/QianYC[P]libycqian/examples/thread/thread_pool.cpp:37:22)>
               ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/QianYC[P]libycqian/examples/thread/thread_pool.cpp:37:22)>
               ::_M_manager;
    ycqian::thread_pool::execute(&pool,(function<void_()> *)local_88);
    std::_Function_base::~_Function_base((_Function_base *)local_88);
  }
  add_promise._M_future.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)printf;
  add_promise._M_future.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_9bf1;
  std::function<void()>::function<std::_Bind<int(*(char_const*))(char_const*,___)>,void>
            ((function<void()> *)local_88,
             (_Bind<int_(*(const_char_*))(const_char_*,____)> *)&add_promise);
  ycqian::thread_pool::execute(&pool,(function<void_()> *)local_88);
  std::_Function_base::~_Function_base((_Function_base *)local_88);
  local_88[0] = (code *)0x64;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)local_88);
  std::promise<int>::promise(&add_promise);
  std::__basic_future<int>::__basic_future
            (&add_future.super___basic_future<int>,&add_promise._M_future);
  local_88[1] = (code *)0x0;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/QianYC[P]libycqian/examples/thread/thread_pool.cpp:58:18)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/QianYC[P]libycqian/examples/thread/thread_pool.cpp:58:18)>
             ::_M_manager;
  local_88[0] = (code *)&add_promise;
  ycqian::thread_pool::execute(&pool,(function<void_()> *)local_88);
  std::_Function_base::~_Function_base((_Function_base *)local_88);
  poVar1 = std::operator<<((ostream *)&std::cout,"the result = ");
  iVar2 = std::future<int>::get(&add_future);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&add_future.super___basic_future<int>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<int>::~promise(&add_promise);
  ycqian::thread_pool::~thread_pool(&pool);
  return 0;
}

Assistant:

int main(int argc, char **argv){
    ycqian::thread_pool pool(8);

    /**
     * calling lambda expression
     */
    for (int i = 0; i < 10; ++i) {
        pool.execute([] {
            std::cout << std::this_thread::get_id() << " do sth...\n";
        });
    }

    /**
     * calling method
     */
    pool.execute(foo);
    pool.execute(bar);
    pool.execute(var);

    /**
     * passing parameters with lambda expression
     */
    for (int j = 0; j < 4; ++j) {
        pool.execute([j] {
            std::cout << "task-" << j << std::endl;
        });
    }

    /**
     * passing parameters with std::bind
     */
    const char *str = "msgmsgmsgmsgmsgmsgmsg";
    pool.execute(std::bind(printf, str));

    /**
     * wait some time to see the output
     */
    std::this_thread::sleep_for(std::chrono::milliseconds(100));

    /**
     * getting return value
     */
    std::promise<int>add_promise;
    std::future<int> add_future = add_promise.get_future();
    pool.execute([&add_promise] {
        //do some task
        add_promise.set_value(10);
    });
    std::cout << "the result = " << add_future.get() << std::endl;
}